

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.h
# Opt level: O2

void __thiscall
Refal2::CNamedQualifierInfo::CNamedQualifierInfo(CNamedQualifierInfo *this,CToken *nameToken)

{
  CToken::CToken(&this->NameToken,nameToken);
  CQualifier::CQualifier(&this->qualifier);
  return;
}

Assistant:

CNamedQualifierInfo( const CToken& nameToken ): NameToken( nameToken ) {}